

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

FileName * __thiscall
embree::FileName::operator+(FileName *__return_storage_ptr__,FileName *this,string *other)

{
  FileName FStack_38;
  
  FileName(&FStack_38,other);
  operator+(__return_storage_ptr__,this,&FStack_38);
  std::__cxx11::string::~string((string *)&FStack_38);
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::operator +( const std::string& other ) const {
    return operator+(FileName(other));
  }